

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O1

void __thiscall
spvtools::opt::IRContext::IRContext(IRContext *this,spv_target_env env,MessageConsumer *c)

{
  _Rb_tree_header *p_Var1;
  _Manager_type p_Var2;
  undefined8 uVar3;
  spv_context psVar4;
  Module *this_00;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type p_Stack_20;
  
  psVar4 = spvContextCreate(env);
  this->syntax_context_ = psVar4;
  (this->grammar_).target_env_ = psVar4->target_env;
  (this->grammar_).operandTable_ = psVar4->operand_table;
  (this->grammar_).opcodeTable_ = psVar4->opcode_table;
  (this->grammar_).extInstTable_ = psVar4->ext_inst_table;
  this->unique_id_ = 0;
  this_00 = (Module *)operator_new(0x590);
  Module::Module(this_00);
  (this->module_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>.
  super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl = this_00;
  *(undefined8 *)&(this->consumer_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->consumer_).super__Function_base._M_functor + 8) = 0;
  (this->consumer_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->consumer_)._M_invoker = c->_M_invoker;
  if ((c->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar3 = *(undefined8 *)((long)&(c->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->consumer_).super__Function_base._M_functor =
         *(undefined8 *)&(c->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->consumer_).super__Function_base._M_functor + 8) = uVar3;
    (this->consumer_).super__Function_base._M_manager = (c->super__Function_base)._M_manager;
    (c->super__Function_base)._M_manager = (_Manager_type)0x0;
    c->_M_invoker = (_Invoker_type)0x0;
  }
  (this->def_use_mgr_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl =
       (DefUseManager *)0x0;
  (this->decoration_mgr_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>._M_head_impl =
       (DecorationManager *)0x0;
  (this->feature_mgr_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
  .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl =
       (FeatureManager *)0x0;
  (this->instr_to_block_)._M_h._M_buckets = &(this->instr_to_block_)._M_h._M_single_bucket;
  (this->instr_to_block_)._M_h._M_bucket_count = 1;
  (this->instr_to_block_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->instr_to_block_)._M_h._M_element_count = 0;
  (this->instr_to_block_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->instr_to_block_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->instr_to_block_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->id_to_func_)._M_h._M_buckets = &(this->id_to_func_)._M_h._M_single_bucket;
  (this->id_to_func_)._M_h._M_bucket_count = 1;
  (this->id_to_func_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->id_to_func_)._M_h._M_element_count = 0;
  (this->id_to_func_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->id_to_func_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->id_to_func_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->valid_analyses_ = kAnalysisNone;
  (this->combinator_ops_)._M_h._M_buckets = &(this->combinator_ops_)._M_h._M_single_bucket;
  (this->combinator_ops_)._M_h._M_bucket_count = 1;
  (this->combinator_ops_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->combinator_ops_)._M_h._M_element_count = 0;
  (this->combinator_ops_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->combinator_ops_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->combinator_ops_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->builtin_var_id_map_)._M_h._M_buckets = &(this->builtin_var_id_map_)._M_h._M_single_bucket;
  (this->builtin_var_id_map_)._M_h._M_bucket_count = 1;
  (this->builtin_var_id_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->builtin_var_id_map_)._M_h._M_element_count = 0;
  (this->builtin_var_id_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  p_Var1 = &(this->dominator_trees_)._M_t._M_impl.super__Rb_tree_header;
  (this->dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->cfg_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
  super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl = (CFG *)0x0;
  (this->builtin_var_id_map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->builtin_var_id_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->post_dominator_trees_)._M_t._M_impl.super__Rb_tree_header;
  (this->post_dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->post_dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->post_dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->post_dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->post_dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->loop_descriptors_)._M_h._M_buckets = &(this->loop_descriptors_)._M_h._M_single_bucket;
  (this->loop_descriptors_)._M_h._M_bucket_count = 1;
  (this->loop_descriptors_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->loop_descriptors_)._M_h._M_element_count = 0;
  (this->loop_descriptors_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->loop_descriptors_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->loop_descriptors_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->constant_mgr_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl =
       (ConstantManager *)0x0;
  (this->type_mgr_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl =
       (TypeManager *)0x0;
  (this->debug_info_mgr_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>._M_head_impl =
       (DebugInfoManager *)0x0;
  (this->id_to_name_)._M_t.
  super___uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
  .
  super__Head_base<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_false>
  ._M_head_impl =
       (multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
        *)0x0;
  (this->scalar_evolution_analysis_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::ScalarEvolutionAnalysis,_std::default_delete<spvtools::opt::ScalarEvolutionAnalysis>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::ScalarEvolutionAnalysis_*,_std::default_delete<spvtools::opt::ScalarEvolutionAnalysis>_>
  .super__Head_base<0UL,_spvtools::opt::ScalarEvolutionAnalysis_*,_false>._M_head_impl =
       (ScalarEvolutionAnalysis *)0x0;
  (this->reg_pressure_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::LivenessAnalysis,_std::default_delete<spvtools::opt::LivenessAnalysis>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::LivenessAnalysis_*,_std::default_delete<spvtools::opt::LivenessAnalysis>_>
  .super__Head_base<0UL,_spvtools::opt::LivenessAnalysis_*,_false>._M_head_impl =
       (LivenessAnalysis *)0x0;
  (this->vn_table_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::ValueNumberTable_*,_std::default_delete<spvtools::opt::ValueNumberTable>_>
  .super__Head_base<0UL,_spvtools::opt::ValueNumberTable_*,_false>._M_head_impl =
       (ValueNumberTable *)0x0;
  (this->inst_folder_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::InstructionFolder,_std::default_delete<spvtools::opt::InstructionFolder>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::InstructionFolder_*,_std::default_delete<spvtools::opt::InstructionFolder>_>
  .super__Head_base<0UL,_spvtools::opt::InstructionFolder_*,_false>._M_head_impl =
       (InstructionFolder *)0x0;
  (this->struct_cfg_analysis_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
  .super__Head_base<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_false>._M_head_impl =
       (StructuredCFGAnalysis *)0x0;
  (this->liveness_mgr_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::analysis::LivenessManager,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::LivenessManager_*,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::LivenessManager_*,_false>._M_head_impl =
       (LivenessManager *)0x0;
  this->max_id_bound_ = 0x3fffff;
  this->preserve_bindings_ = false;
  this->preserve_spec_constants_ = false;
  psVar4 = this->syntax_context_;
  local_28 = (_Manager_type)0x0;
  p_Stack_20 = (_Invoker_type)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  p_Var2 = (this->consumer_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)(&local_38,(_Any_data *)&this->consumer_,__clone_functor);
    p_Stack_20 = (this->consumer_)._M_invoker;
    local_28 = (this->consumer_).super__Function_base._M_manager;
  }
  SetContextMessageConsumer(psVar4,(MessageConsumer *)&local_38);
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  ((this->module_)._M_t.
   super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>._M_t.
   super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>.
   super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->context_ = this;
  return;
}

Assistant:

IRContext(spv_target_env env, MessageConsumer c)
      : syntax_context_(spvContextCreate(env)),
        grammar_(syntax_context_),
        unique_id_(0),
        module_(new Module()),
        consumer_(std::move(c)),
        def_use_mgr_(nullptr),
        feature_mgr_(nullptr),
        valid_analyses_(kAnalysisNone),
        constant_mgr_(nullptr),
        type_mgr_(nullptr),
        id_to_name_(nullptr),
        max_id_bound_(kDefaultMaxIdBound),
        preserve_bindings_(false),
        preserve_spec_constants_(false) {
    SetContextMessageConsumer(syntax_context_, consumer_);
    module_->SetContext(this);
  }